

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseDenseProduct.h
# Opt level: O3

void Eigen::internal::
     sparse_time_dense_product_impl<Eigen::SparseMatrix<float,_0,_int>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_float,_0,_true>
     ::run(SparseMatrix<float,_0,_int> *lhs,Matrix<float,__1,_1,_0,__1,_1> *rhs,
          Matrix<float,__1,_1,_0,__1,_1> *res,float *alpha)

{
  float fVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  StorageIndex *pSVar5;
  float *pfVar6;
  Scalar *pSVar7;
  StorageIndex *pSVar8;
  StorageIndex *pSVar9;
  float *pfVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  lVar4 = lhs->m_outerSize;
  if (0 < lVar4) {
    pSVar5 = lhs->m_outerIndex;
    pfVar6 = (rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pSVar7 = (lhs->m_data).m_values;
    pSVar8 = (lhs->m_data).m_indices;
    pSVar9 = lhs->m_innerNonZeros;
    pfVar10 = (res->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar12 = 0;
    do {
      lVar11 = (long)pSVar5[lVar12];
      if (pSVar9 == (StorageIndex *)0x0) {
        lVar13 = (long)pSVar5[lVar12 + 1];
      }
      else {
        lVar13 = pSVar9[lVar12] + lVar11;
      }
      if (lVar11 < lVar13) {
        fVar1 = *alpha;
        fVar2 = pfVar6[lVar12];
        do {
          iVar3 = pSVar8[lVar11];
          pfVar10[iVar3] = pSVar7[lVar11] * fVar1 * fVar2 + pfVar10[iVar3];
          lVar11 = lVar11 + 1;
        } while (lVar13 != lVar11);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar4);
  }
  return;
}

Assistant:

static void run(const SparseLhsType& lhs, const DenseRhsType& rhs, DenseResType& res, const AlphaType& alpha)
  {
    LhsEval lhsEval(lhs);
    for(Index c=0; c<rhs.cols(); ++c)
    {
      for(Index j=0; j<lhs.outerSize(); ++j)
      {
//        typename Res::Scalar rhs_j = alpha * rhs.coeff(j,c);
        typename ScalarBinaryOpTraits<AlphaType, typename Rhs::Scalar>::ReturnType rhs_j(alpha * rhs.coeff(j,c));
        for(LhsInnerIterator it(lhsEval,j); it ;++it)
          res.coeffRef(it.index(),c) += it.value() * rhs_j;
      }
    }
  }